

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopCreateInverse(Kit_Sop_t *cResult,Vec_Int_t *vInput,int nLits,Vec_Int_t *vMemory)

{
  int nWords;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int local_34;
  int nCubes;
  int i;
  uint uMask;
  uint uCube;
  Vec_Int_t *vMemory_local;
  int nLits_local;
  Vec_Int_t *vInput_local;
  Kit_Sop_t *cResult_local;
  
  nWords = Vec_IntSize(vInput);
  cResult->nCubes = 0;
  puVar3 = Vec_IntFetch(vMemory,nWords);
  cResult->pCubes = puVar3;
  for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
    uVar1 = Vec_IntEntry(vInput,local_34);
    uVar2 = (uVar1 | uVar1 >> 1) & 0x55555555;
    Kit_SopPushCube(cResult,uVar1 ^ (uVar2 << 1 | uVar2));
  }
  return;
}

Assistant:

void Kit_SopCreateInverse( Kit_Sop_t * cResult, Vec_Int_t * vInput, int nLits, Vec_Int_t * vMemory )
{
    unsigned uCube, uMask = 0;
    int i, nCubes = Vec_IntSize(vInput);
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, nCubes );
    // add the cubes
//    Vec_IntForEachEntry( vInput, uCube, i )
    for ( i = 0; i < nCubes; i++ )
    {
        uCube = Vec_IntEntry( vInput, i );
        uMask = ((uCube | (uCube >> 1)) & 0x55555555);
        uMask |= (uMask << 1);
        Kit_SopPushCube( cResult, uCube ^ uMask );
    }
}